

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

void Bdc_SpfdDecomposeTest(void)

{
  uint uVar1;
  Vec_Wrd_t *p;
  word *pwVar2;
  word wVar3;
  Vec_Wrd_t *p_00;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  timespec ts;
  timespec local_40;
  
  Aig_ManRandom64(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x4000000;
  p->nSize = 0;
  pwVar2 = (word *)malloc(0x20000000);
  p->pArray = pwVar2;
  iVar6 = 0x4000000;
  do {
    wVar3 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar3);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  pwVar2 = (word *)malloc(0x80);
  p_00->pArray = pwVar2;
  iVar6 = 8;
  do {
    wVar3 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar3);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar1 = p->nSize;
  if ((int)uVar1 < 1) {
    uVar10 = 0;
  }
  else {
    uVar5 = 0;
    uVar10 = 0;
    do {
      if (0 < p_00->nSize) {
        uVar11 = 0;
        do {
          uVar10 = (ulong)((int)uVar10 +
                          (uint)(((uint)p_00->pArray[uVar11] & ~(uint)p->pArray[uVar5]) == 0));
          uVar11 = uVar11 + 1;
        } while ((uint)p_00->nSize != uVar11);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  printf("Total = %8d.  ",uVar10);
  iVar9 = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  uVar7 = 0;
  Abc_Print(iVar9,"%s =","Time");
  Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar12 + lVar4) / 1000000.0);
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (0 < (long)p_00->nSize) {
    lVar12 = 0;
    uVar7 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar10 = 0;
        do {
          uVar8 = (uint)p_00->pArray[lVar12];
          uVar7 = uVar7 + (((uint)p->pArray[uVar10] & uVar8) == uVar8);
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != p_00->nSize);
  }
  printf("Total = %8d.  ",(ulong)uVar7);
  iVar9 = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar9,"%s =","Time");
  Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar12 + lVar4) / 1000000.0);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest()
{
  int nSizeM = (1 << 26);  // big array size
  int nSizeK = (1 << 3);   // small array size
  Vec_Wrd_t * v1M, * v1K;
  int EntryM, EntryK;
  int i, k, Counter;
  abctime clk;

  Aig_ManRandom64( 1 );

  v1M = Vec_WrdAlloc( nSizeM );
  for ( i = 0; i < nSizeM; i++ )
      Vec_WrdPush( v1M, Aig_ManRandom64(0) );

  v1K = Vec_WrdAlloc( nSizeK );
  for ( i = 0; i < nSizeK; i++ )
      Vec_WrdPush( v1K, Aig_ManRandom64(0) );

  clk = Abc_Clock();
  Counter = 0;
//  for ( i = 0; i < nSizeM; i++ )
//  for ( k = 0; k < nSizeK; k++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1M, EntryM, i )
  Vec_WrdForEachEntry( v1K, EntryK, k )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

  clk = Abc_Clock();
  Counter = 0;
//  for ( k = 0; k < nSizeK; k++ )
//  for ( i = 0; i < nSizeM; i++ )
//      Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
  Vec_WrdForEachEntry( v1K, EntryK, k )
  Vec_WrdForEachEntry( v1M, EntryM, i )
      Counter += ((EntryM & EntryK) == EntryK);
  printf( "Total = %8d.  ", Counter );
  Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}